

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O2

void * FilterRender::doSlice
                 (void *data,uint width,uint height,
                 vector<Geometry::Point,_std::allocator<Geometry::Point>_> *poly)

{
  ulong uVar1;
  bool bVar2;
  int i_1;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  int i;
  ulong uVar7;
  int j;
  ulong uVar8;
  ulong uVar9;
  Point local_58;
  vector<Geometry::Point,_std::allocator<Geometry::Point>_> local_48;
  
  uVar1 = (ulong)width;
  uVar8 = (ulong)height;
  pvVar3 = operator_new__(uVar8 * 8);
  for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    pvVar4 = operator_new__(uVar1 * 8);
    *(void **)((long)pvVar3 + uVar7 * 8) = pvVar4;
    for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
      pvVar5 = operator_new__(4);
      *(void **)((long)pvVar4 + uVar9 * 8) = pvVar5;
    }
  }
  pvVar4 = data;
  for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar7 * 8) + uVar9 * 8) + lVar6) =
             *(undefined1 *)((long)pvVar4 + lVar6);
      }
      pvVar4 = (void *)((long)pvVar4 + 4);
    }
  }
  for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    uVar9 = 0;
    while( true ) {
      if (uVar9 == uVar1) break;
      Geometry::Point::Point(&local_58,(double)(int)uVar7,(double)(int)uVar9);
      std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::vector(&local_48,poly);
      bVar2 = Geometry::InPoly(&local_58,&local_48);
      std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::~vector(&local_48);
      Geometry::Point::~Point(&local_58);
      if (!bVar2) {
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar7 * 8) + uVar9 * 8) + lVar6) = 0;
        }
      }
      uVar9 = uVar9 + 1;
    }
  }
  for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        *(undefined1 *)((long)data + lVar6) =
             *(undefined1 *)(*(long *)(*(long *)((long)pvVar3 + uVar7 * 8) + uVar9 * 8) + lVar6);
      }
      data = (void *)((long)data + 4);
    }
  }
  uVar7 = 0;
  do {
    if (uVar7 == uVar8) {
      operator_delete__(pvVar3);
    }
    for (uVar9 = 0; pvVar4 = *(void **)((long)pvVar3 + uVar7 * 8), uVar1 != uVar9; uVar9 = uVar9 + 1
        ) {
      pvVar4 = *(void **)((long)pvVar4 + uVar9 * 8);
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
    }
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void* FilterRender::doSlice(void *data, uint width, uint height, std::vector<Point> poly) {
	unsigned char ***map;

	map = new unsigned char**[height];
	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			if (!InPoly(Point(i, j), poly)) {
				for (int k = 0; k < 4; k++) {
					map[i][j][k] = 0;
				}
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}